

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SequenceRepetitionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SequenceRepetitionSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SelectorSyntax*&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,SelectorSyntax **args_2,Token *args_3)

{
  Token openBracket;
  Token op;
  Token closeBracket;
  SequenceRepetitionSyntax *this_00;
  Token *args_local_3;
  SelectorSyntax **args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (SequenceRepetitionSyntax *)allocate(this,0x48,8);
  openBracket.kind = args->kind;
  openBracket._2_1_ = args->field_0x2;
  openBracket.numFlags.raw = (args->numFlags).raw;
  openBracket.rawLen = args->rawLen;
  openBracket.info = args->info;
  op.kind = args_1->kind;
  op._2_1_ = args_1->field_0x2;
  op.numFlags.raw = (args_1->numFlags).raw;
  op.rawLen = args_1->rawLen;
  op.info = args_1->info;
  closeBracket.kind = args_3->kind;
  closeBracket._2_1_ = args_3->field_0x2;
  closeBracket.numFlags.raw = (args_3->numFlags).raw;
  closeBracket.rawLen = args_3->rawLen;
  closeBracket.info = args_3->info;
  slang::syntax::SequenceRepetitionSyntax::SequenceRepetitionSyntax
            (this_00,openBracket,op,*args_2,closeBracket);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }